

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

Ivy_Obj_t * Ivy_FraigAnd(Ivy_FraigMan_t *p,Ivy_Obj_t *pObjOld)

{
  uint uVar1;
  int iVar2;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pIVar5;
  int RetValue;
  Ivy_Obj_t *pObjReprNew;
  Ivy_Obj_t *pFanin1New;
  Ivy_Obj_t *pFanin0New;
  Ivy_Obj_t *pObjNew;
  Ivy_Obj_t *pObjOld_local;
  Ivy_FraigMan_t *p_local;
  
  pIVar3 = Ivy_ObjChild0Equiv(pObjOld);
  pIVar4 = Ivy_ObjChild1Equiv(pObjOld);
  p_local = (Ivy_FraigMan_t *)Ivy_And(p->pManFraig,pIVar3,pIVar4);
  pIVar3 = Ivy_ObjClassNodeRepr(pObjOld);
  if ((pIVar3 != (Ivy_Obj_t *)0x0) &&
     ((p->pParams->fDoSparse != 0 ||
      (pIVar3 = Ivy_ObjClassNodeRepr(pObjOld), pIVar3 != p->pManAig->pConst1)))) {
    pIVar3 = Ivy_ObjClassNodeRepr(pObjOld);
    pIVar3 = Ivy_ObjFraig(pIVar3);
    pIVar4 = Ivy_Regular((Ivy_Obj_t *)p_local);
    pIVar5 = Ivy_Regular(pIVar3);
    if (pIVar4 != pIVar5) {
      pIVar4 = Ivy_Regular((Ivy_Obj_t *)p_local);
      pIVar5 = Ivy_ManConst1(p->pManFraig);
      if (pIVar4 == pIVar5) {
        __assert_fail("Ivy_Regular(pObjNew) != Ivy_ManConst1(p->pManFraig)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFraig.c"
                      ,0x802,"Ivy_Obj_t *Ivy_FraigAnd(Ivy_FraigMan_t *, Ivy_Obj_t *)");
      }
      pIVar4 = Ivy_Regular(pIVar3);
      pIVar5 = Ivy_Regular((Ivy_Obj_t *)p_local);
      iVar2 = Ivy_FraigNodesAreEquiv(p,pIVar4,pIVar5);
      if (iVar2 == 1) {
        pIVar4 = Ivy_ObjClassNodeNext(pObjOld);
        if (pIVar4 == (Ivy_Obj_t *)0x0) {
          pIVar4 = Ivy_ObjClassNodeRepr(pObjOld);
          *(uint *)&pIVar4->field_0x8 = *(uint *)&pIVar4->field_0x8 & 0xffffffef | 0x10;
        }
        uVar1 = *(uint *)&pObjOld->field_0x8;
        pIVar4 = Ivy_ObjClassNodeRepr(pObjOld);
        p_local = (Ivy_FraigMan_t *)
                  Ivy_NotCond(pIVar3,uVar1 >> 7 & 1 ^ *(uint *)&pIVar4->field_0x8 >> 7 & 1);
      }
      else if (iVar2 != -1) {
        Ivy_FraigResimulate(p);
      }
    }
  }
  return (Ivy_Obj_t *)p_local;
}

Assistant:

Ivy_Obj_t * Ivy_FraigAnd( Ivy_FraigMan_t * p, Ivy_Obj_t * pObjOld )
{ 
    Ivy_Obj_t * pObjNew, * pFanin0New, * pFanin1New, * pObjReprNew;
    int RetValue;
    // get the fraiged fanins
    pFanin0New = Ivy_ObjChild0Equiv(pObjOld);
    pFanin1New = Ivy_ObjChild1Equiv(pObjOld);
    // get the candidate fraig node
    pObjNew = Ivy_And( p->pManFraig, pFanin0New, pFanin1New );
    // get representative of this class
    if ( Ivy_ObjClassNodeRepr(pObjOld) == NULL || // this is a unique node
         (!p->pParams->fDoSparse && Ivy_ObjClassNodeRepr(pObjOld) == p->pManAig->pConst1) ) // this is a sparse node
    {
//        assert( Ivy_Regular(pFanin0New) != Ivy_Regular(pFanin1New) );
//        assert( pObjNew != Ivy_Regular(pFanin0New) );
//        assert( pObjNew != Ivy_Regular(pFanin1New) );
        return pObjNew;
    }
    // get the fraiged representative
    pObjReprNew = Ivy_ObjFraig(Ivy_ObjClassNodeRepr(pObjOld));
    // if the fraiged nodes are the same return
    if ( Ivy_Regular(pObjNew) == Ivy_Regular(pObjReprNew) )
        return pObjNew;
    assert( Ivy_Regular(pObjNew) != Ivy_ManConst1(p->pManFraig) );
//    printf( "Node = %d. Repr = %d.\n", pObjOld->Id, Ivy_ObjClassNodeRepr(pObjOld)->Id );

    // they are different (the counter-example is in p->pPatWords)
    RetValue = Ivy_FraigNodesAreEquiv( p, Ivy_Regular(pObjReprNew), Ivy_Regular(pObjNew) );
    if ( RetValue == 1 )  // proved equivalent
    {
        // mark the class as proved
        if ( Ivy_ObjClassNodeNext(pObjOld) == NULL )
            Ivy_ObjClassNodeRepr(pObjOld)->fMarkA = 1;
        return Ivy_NotCond( pObjReprNew, pObjOld->fPhase ^ Ivy_ObjClassNodeRepr(pObjOld)->fPhase );
    }
    if ( RetValue == -1 ) // failed
        return pObjNew;
    // simulate the counter-example and return the new node
    Ivy_FraigResimulate( p );
    return pObjNew;
}